

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O1

CreatorType
GEO::Factory<GEO::FactoryCreator1<GEO::Delaunay,_unsigned_char>_>::find_creator(string *name)

{
  Factory<GEO::FactoryCreator1<GEO::Delaunay,_unsigned_char>_> *pFVar1;
  iterator iVar2;
  CreatorType p_Var3;
  
  pFVar1 = InstanceRepo::instance<GEO::Factory<GEO::FactoryCreator1<GEO::Delaunay,unsigned_char>>>()
  ;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::Delaunay_*(*)(const_unsigned_char_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::Delaunay_*(*)(const_unsigned_char_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::Delaunay_*(*)(const_unsigned_char_&)>_>_>
          ::find(&(pFVar1->registry_)._M_t,name);
  if ((_Rb_tree_header *)iVar2._M_node == &(pFVar1->registry_)._M_t._M_impl.super__Rb_tree_header) {
    p_Var3 = (CreatorType)0x0;
  }
  else {
    p_Var3 = *(CreatorType *)(iVar2._M_node + 2);
  }
  return p_Var3;
}

Assistant:

static CreatorType find_creator(const std::string& name) {
            Factory& self = instance();
            auto i = self.registry_.find(name);
            return i == self.registry_.end() ? nullptr : i->second;
        }